

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_read.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint len;
  int iVar1;
  ssize_t sVar2;
  nettlp_pcie_cfg *__buf;
  char *pcVar3;
  size_t sStack_860;
  uint16_t addr;
  uint local_84c;
  nettlp_pcie_cfg ntpc;
  char buf [2048];
  
  addr = 0;
  memset(buf,0,0x800);
  ntpc.remote_addr.s_addr = 0;
  ntpc.local_addr.s_addr = 0;
  ntpc.sockfd = 0;
  local_84c = 0;
LAB_00102498:
  while (iVar1 = getopt(argc,argv,"r:l:a:s:h"), iVar1 == 0x61) {
    iVar1 = __isoc99_sscanf(_optarg,"0x%hx",&addr);
    if (iVar1 < 1) {
      pcVar3 = "invalid address\n";
      sStack_860 = 0x10;
LAB_001025a8:
      fwrite(pcVar3,sStack_860,1,_stderr);
      return -1;
    }
  }
  __buf = (nettlp_pcie_cfg *)&ntpc.local_addr;
  if (iVar1 != 0x6c) {
    if (iVar1 != 0x72) {
      if (iVar1 == -1) {
        iVar1 = nettlp_pcie_cfg_init(&ntpc);
        len = local_84c;
        if (iVar1 < 0) {
          pcVar3 = "nettlp_pcie_cfg_init";
        }
        else {
          sVar2 = nettlp_pcie_cfg_read(&ntpc,addr,buf,(ulong)local_84c);
          if (-1 < (int)sVar2) {
            hexdump(buf,len);
            return 0;
          }
          pcVar3 = "nettlp_pcie_cfg_read";
        }
        goto LAB_001025c3;
      }
      if (iVar1 != 0x73) {
        usage();
        return -1;
      }
      local_84c = atoi(_optarg);
      if (local_84c - 0x801 < 0xfffff800) {
        pcVar3 = "invalid size\n";
        sStack_860 = 0xd;
        goto LAB_001025a8;
      }
      goto LAB_00102498;
    }
    __buf = &ntpc;
  }
  iVar1 = inet_pton(2,_optarg,__buf);
  if (iVar1 < 1) {
    pcVar3 = "inet_pton";
LAB_001025c3:
    perror(pcVar3);
    return -1;
  }
  goto LAB_00102498;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	char buf[2048];
	int size = 0;
	uint16_t addr = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(buf, 0, sizeof(buf));
	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 's':
			size = atoi(optarg);
			if (size < 1 || size > sizeof(buf)) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_read(&ntpc, addr, buf, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_read");
		return -1;
	}
	
	hexdump(buf, size);

	return 0;
}